

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O3

void __thiscall SocketPP::TCPServer::onConnected(TCPServer *this,int fd)

{
  iterator __position;
  int iVar1;
  TCPStream stream;
  TCPStream local_1c;
  
  local_1c.fd = fd;
  printf("\x1b[33m%s: get an accept:%d\x1b[m\n","TCPServer.cpp",fd);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->streamMutex_);
  if (iVar1 == 0) {
    __position._M_current =
         (this->connectedStreams_).
         super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->connectedStreams_).
        super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SocketPP::TCPStream,std::allocator<SocketPP::TCPStream>>::
      _M_realloc_insert<SocketPP::TCPStream_const&>
                ((vector<SocketPP::TCPStream,std::allocator<SocketPP::TCPStream>> *)
                 &this->connectedStreams_,__position,&local_1c);
    }
    else {
      (__position._M_current)->fd = fd;
      (this->connectedStreams_).
      super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
    printf("\x1b[33m%s: connectedStreams_.size()=%ld\x1b[m\n","TCPServer.cpp",
           (long)(this->connectedStreams_).
                 super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->connectedStreams_).
                 super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
    if ((this->connHandle_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->connHandle_)._M_invoker)((_Any_data *)&this->connHandle_,&local_1c);
    }
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void TCPServer::onConnected(int fd) {
    TCPStream stream(fd);

    LOGD("get an accept:%d", stream.fd);
    streamMutex_.lock();
    connectedStreams_.push_back(stream);
    streamMutex_.unlock();

    LOGD("connectedStreams_.size()=%ld", connectedStreams_.size());

    if (connHandle_)
        connHandle_(stream);
}